

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

void us_socket_remote_address(int ssl,us_socket_t *s,char *buf,int *length)

{
  int iVar1;
  bsd_addr_t addr;
  
  iVar1 = us_poll_fd(&s->p);
  addr.len = 0x80;
  iVar1 = getpeername(iVar1,(sockaddr *)&addr,&addr.len);
  if (iVar1 == 0) {
    if (addr.mem.ss_family == 10) {
      addr.ip = addr.mem.__ss_padding + 6;
      addr.ip_length = 0x10;
    }
    else {
      addr.ip_length = 0;
      if (addr.mem.ss_family == 2) {
        addr.ip = addr.mem.__ss_padding + 2;
        addr.ip_length = 4;
      }
    }
    if (addr.ip_length <= *length) {
      *length = addr.ip_length;
      memcpy(buf,addr.ip,(ulong)(uint)addr.ip_length);
      return;
    }
  }
  *length = 0;
  return;
}

Assistant:

void us_socket_remote_address(int ssl, struct us_socket_t *s, char *buf, int *length) {
    struct bsd_addr_t addr;
    if (bsd_socket_addr(us_poll_fd(&s->p), &addr) || *length < bsd_addr_get_ip_length(&addr)) {
        *length = 0;
    } else {
        *length = bsd_addr_get_ip_length(&addr);
        memcpy(buf, bsd_addr_get_ip(&addr), *length);
    }
}